

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O3

size_t err_format_msg(char *outbuf,size_t outbuflen,char *msg,CVmException *exc)

{
  char cVar1;
  byte bVar2;
  err_param_type eVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  unsigned_long uVar7;
  size_t sVar8;
  char *pcVar9;
  int iVar10;
  CVmExcParam *pCVar11;
  char *__s;
  char srcbuf [30];
  char local_58;
  byte local_57;
  undefined1 local_56;
  CVmExcParam *local_38;
  
  if (exc == (CVmException *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = exc->param_count_;
  }
  if (msg != (char *)0x0) {
    pCVar11 = exc->params_;
    iVar10 = 0;
    sVar4 = 0;
    local_38 = pCVar11;
    do {
      cVar1 = *msg;
      if (cVar1 == '%') {
        if (iVar10 < iVar5) {
          eVar3 = pCVar11[iVar10].type_;
          bVar2 = msg[1];
          if (bVar2 < 0x73) {
            __s = "%";
            if (bVar2 != 0x25) {
              if (bVar2 == 100) {
                if (eVar3 == ERR_TYPE_ULONG) {
                  uVar7 = pCVar11[iVar10].val_.ulong_;
                  pcVar9 = "%ld";
                  goto LAB_002495ac;
                }
                __s = "d";
                if (eVar3 == ERR_TYPE_INT) {
                  uVar6 = (ulong)(uint)pCVar11[iVar10].val_.intval_;
                  pcVar9 = "%d";
                  goto LAB_0024954e;
                }
              }
              else {
LAB_00249557:
                local_58 = '%';
                local_56 = 0;
                __s = &local_58;
                local_57 = bVar2;
              }
            }
LAB_002495b3:
            sVar8 = strlen(__s);
          }
          else {
            if (bVar2 == 0x78) {
              if (eVar3 == ERR_TYPE_ULONG) {
                uVar7 = pCVar11[iVar10].val_.ulong_;
                pcVar9 = "%lx";
LAB_002495ac:
                __s = &local_58;
                sprintf(__s,pcVar9,uVar7);
              }
              else {
                __s = "x";
                if (eVar3 == ERR_TYPE_INT) {
                  uVar6 = (ulong)(uint)pCVar11[iVar10].val_.intval_;
                  pcVar9 = "%x";
LAB_0024954e:
                  __s = &local_58;
                  sprintf(__s,pcVar9,uVar6);
                }
              }
              goto LAB_002495b3;
            }
            if (bVar2 == 0x75) {
              if (eVar3 == ERR_TYPE_ULONG) {
                uVar7 = pCVar11[iVar10].val_.ulong_;
                pcVar9 = "%lu";
                goto LAB_002495ac;
              }
              __s = "u";
              if (eVar3 == ERR_TYPE_INT) {
                uVar6 = (ulong)(uint)pCVar11[iVar10].val_.intval_;
                pcVar9 = "%u";
                goto LAB_0024954e;
              }
              goto LAB_002495b3;
            }
            if (bVar2 != 0x73) goto LAB_00249557;
            if (eVar3 != ERR_TYPE_CHAR_LEN) {
              if ((eVar3 == ERR_TYPE_CHAR) || (__s = "s", eVar3 == ERR_TYPE_TEXTCHAR)) {
                __s = pCVar11[iVar10].val_.charval_;
              }
              goto LAB_002495b3;
            }
            __s = pCVar11[iVar10].val_.strval_;
            sVar8 = pCVar11[iVar10].val_.charlenval_.len_;
          }
          if (1 < outbuflen) {
            uVar6 = outbuflen - 1;
            if (sVar8 < outbuflen - 1) {
              uVar6 = sVar8;
            }
            memcpy(outbuf,__s,uVar6);
            outbuf = outbuf + uVar6;
            outbuflen = outbuflen - uVar6;
            pCVar11 = local_38;
          }
          msg = msg + 1;
          iVar10 = iVar10 + 1;
        }
        else {
          sVar8 = 1;
          if (1 < outbuflen) {
            *outbuf = '%';
            goto LAB_002494b1;
          }
        }
      }
      else {
        if (cVar1 == '\0') goto LAB_0024961d;
        sVar8 = 1;
        if (1 < outbuflen) {
          *outbuf = cVar1;
LAB_002494b1:
          outbuflen = outbuflen - 1;
          sVar8 = 1;
          outbuf = outbuf + 1;
        }
      }
      sVar4 = sVar4 + sVar8;
      msg = msg + 1;
    } while( true );
  }
  sVar4 = 1;
LAB_0024961d:
  if (outbuflen != 0) {
    *outbuf = '\0';
  }
  return sVar4;
}

Assistant:

size_t err_format_msg(char *outbuf, size_t outbuflen,
                      const char *msg, const CVmException *exc)
{
    int curarg;
    const char *p;
    char *dst;
    int exc_argc;
    size_t need = 0;
    size_t rem = outbuflen;

    /* get the number of parameters in the exception object */
    exc_argc = (exc == 0 ? 0 : exc->get_param_count());

    /* start with the first parameter */
    curarg = 0;

    /* start at the beginning of the buffer */
    dst = outbuf;

    /* if there's no message, there's nothing to return */
    if (msg == 0)
    {
        ++need;
        if (outbuflen != 0)
            *dst = '\0';
        return need;
    }

    /* scan the format string for formatting codes */
    for (p = msg ; *p != '\0' ; ++p)
    {
        /* if it's a format specifier, translate it */
        if (*p == '%')
        {
            const char *src;
            char srcbuf[30];
            err_param_type typ;
            size_t len;
            int use_strlen;
            
            /* 
             *   if no more parameters are available, ignore the
             *   formatting code entirely, and leave it in the string as
             *   it is 
             */
            if (curarg >= exc_argc)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *p;
                continue;
            }

            /* get the type of the current parameter */
            typ = exc->get_param_type(curarg);
            
            /* 
             *   presume we'll want to use strlen to get the length of the
             *   source value 
             */
            use_strlen = TRUE;
            
            /* skip the '%' and determine what follows */
            ++p;
            switch (*p)
            {
            case 's':
                /* get the string value using the appropriate type */
                if (typ == ERR_TYPE_TEXTCHAR)
                    src = exc->get_param_text(curarg);
                else if (typ == ERR_TYPE_CHAR)
                    src = exc->get_param_char(curarg);
                else if (typ == ERR_TYPE_CHAR_LEN)
                {
                    /* get the string value and its length */
                    src = exc->get_param_char_len(curarg, &len);

                    /* 
                     *   src isn't null terminated, so don't use strlen to
                     *   get its length - we already have it from the
                     *   parameter data 
                     */
                    use_strlen = FALSE;
                }
                else
                    src = "s";
                break;

            case 'd':
                src = srcbuf;
                if (typ == ERR_TYPE_INT)
                    sprintf(srcbuf, "%d", exc->get_param_int(curarg));
                else if (typ == ERR_TYPE_ULONG)
                    sprintf(srcbuf, "%ld", exc->get_param_ulong(curarg));
                else
                    src = "d";
                break;

            case 'u':
                src = srcbuf;
                if (typ == ERR_TYPE_INT)
                    sprintf(srcbuf, "%u", exc->get_param_int(curarg));
                else if (typ == ERR_TYPE_ULONG)
                    sprintf(srcbuf, "%lu", exc->get_param_ulong(curarg));
                else
                    src = "u";
                break;

            case 'x':
                src = srcbuf;
                if (typ == ERR_TYPE_INT)
                    sprintf(srcbuf, "%x", exc->get_param_int(curarg));
                else if (typ == ERR_TYPE_ULONG)
                    sprintf(srcbuf, "%lx", exc->get_param_ulong(curarg));
                else
                    src = "x";
                break;

            case '%':
                /* add a single percent sign */
                src = "%";
                break;

            default:
                /* invalid format character; leave the whole thing intact */
                src = srcbuf;
                srcbuf[0] = '%';
                srcbuf[1] = *p;
                srcbuf[2] = '\0';
                break;
            }

            /* get the length, if it's null-terminated */
            if (use_strlen)
                len = strlen(src);

            /* count the full 'len' in our space needs */
            need +=len;

            /* copy as much as we can */
            if (rem > 1)
            {
                /* limit it to the remaining space, minus a null byte */
                if (len > rem - 1)
                    len = rem - 1;

                /* copy the value and advance past it in the output buffer */
                memcpy(dst, src, len);
                dst += len;
                rem -= len;
            }

            /* consume the argument */
            ++curarg;
        }
        else
        {
            /* just copy the current character as it is */
            ++need;
            if (rem > 1)
                --rem, *dst++ = *p;
        }
    }

    /* add the trailing null */
    if (rem != 0)
        *dst++ = '\0';

    /* return the space required */
    return need;
}